

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qparallelanimationgroup.cpp
# Opt level: O1

void __thiscall
QParallelAnimationGroup::QParallelAnimationGroup(QParallelAnimationGroup *this,QObject *parent)

{
  QAnimationGroupPrivate *dd;
  
  dd = (QAnimationGroupPrivate *)operator_new(200);
  QAbstractAnimationPrivate::QAbstractAnimationPrivate((QAbstractAnimationPrivate *)dd);
  (dd->animations).d.d = (Data *)0x0;
  (dd->animations).d.ptr = (QAbstractAnimation **)0x0;
  (dd->animations).d.size = 0;
  (dd->super_QAbstractAnimationPrivate).isGroup = true;
  (dd->super_QAbstractAnimationPrivate).super_QObjectPrivate.super_QObjectData._vptr_QObjectData =
       (_func_int **)&PTR__QParallelAnimationGroupPrivate_006ae9c8;
  dd[1].super_QAbstractAnimationPrivate.super_QObjectPrivate.super_QObjectData._vptr_QObjectData =
       (_func_int **)0x0;
  dd[1].super_QAbstractAnimationPrivate.super_QObjectPrivate.super_QObjectData.q_ptr =
       (QObject *)0x0;
  QAnimationGroup::QAnimationGroup((QAnimationGroup *)this,dd,parent);
  *(undefined ***)this = &PTR_metaObject_006ae8f0;
  return;
}

Assistant:

QParallelAnimationGroup::QParallelAnimationGroup(QObject *parent)
    : QAnimationGroup(*new QParallelAnimationGroupPrivate, parent)
{
}